

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

int __thiscall QTextCursor::columnNumber(QTextCursor *this)

{
  bool bVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  QTextBlock *in_RDI;
  long in_FS_OFFSET;
  QTextLine QVar4;
  int relativePos;
  QTextLayout *layout;
  QTextLine line;
  QTextBlock block;
  QTextBlock *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int pos;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_2c;
  undefined1 *local_28;
  QTextEngine *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6f1a);
  if ((bVar1) ||
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6f28),
     pQVar3->priv == (QTextDocumentPrivate *)0x0)) {
    local_2c = 0;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6f5e);
    QTextCursorPrivate::block
              ((QTextCursorPrivate *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = QTextBlock::isValid((QTextBlock *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (bVar1) {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6f90);
      QTextCursorPrivate::blockLayout
                ((QTextCursorPrivate *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                 ,in_RDI);
      pos = (int)((ulong)in_RDI >> 0x20);
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6fac);
      local_2c = pQVar3->position;
      iVar2 = QTextBlock::position(in_stack_ffffffffffffff98);
      local_2c = local_2c - iVar2;
      iVar2 = QTextLayout::lineCount((QTextLayout *)0x7a6fd3);
      if (iVar2 != 0) {
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
        QVar4 = QTextLayout::lineForTextPosition
                          ((QTextLayout *)CONCAT44(local_2c,in_stack_ffffffffffffffb8),pos);
        local_20 = QVar4.eng;
        local_28 = (undefined1 *)CONCAT44(local_28._4_4_,QVar4.index);
        bVar1 = QTextLine::isValid((QTextLine *)&local_28);
        if (bVar1) {
          iVar2 = QTextLine::textStart((QTextLine *)0x7a703b);
          local_2c = local_2c - iVar2;
        }
        else {
          local_2c = 0;
        }
      }
    }
    else {
      local_2c = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

int QTextCursor::columnNumber() const
{
    if (!d || !d->priv)
        return 0;

    QTextBlock block = d->block();
    if (!block.isValid())
        return 0;

    const QTextLayout *layout = d->blockLayout(block);

    const int relativePos = d->position - block.position();

    if (layout->lineCount() == 0)
        return relativePos;

    QTextLine line = layout->lineForTextPosition(relativePos);
    if (!line.isValid())
        return 0;
    return relativePos - line.textStart();
}